

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void deserialize_model<char_const*,int,unsigned_long>
               (Imputer *model,char **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian,bool lacks_range_penalty,bool lacks_scoring_metric)

{
  vector<int,_std::allocator<int>_> *this;
  vector<double,_std::allocator<double>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  pointer pvVar1;
  pointer pIVar2;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *tree;
  pointer this_02;
  ImputeNode *node;
  pointer node_00;
  size_t veclen;
  size_t data_sizets [6];
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long,unsigned_long>(data_sizets,6,in,buffer,diff_endian);
    model->ncols_numeric = data_sizets[0];
    model->ncols_categ = data_sizets[1];
    this = &model->ncat;
    std::vector<int,_std::allocator<int>_>::resize(this,data_sizets[2]);
    std::
    vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ::resize(&model->imputer_tree,data_sizets[3]);
    this_00 = &model->col_means;
    std::vector<double,_std::allocator<double>_>::resize(this_00,data_sizets[4]);
    this_01 = &model->col_modes;
    std::vector<int,_std::allocator<int>_>::resize(this_01,data_sizets[5]);
    std::vector<int,_std::allocator<int>_>::_M_shrink_to_fit(this);
    std::
    vector<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
    ::_M_shrink_to_fit(&model->imputer_tree);
    std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(this_00);
    std::vector<int,_std::allocator<int>_>::_M_shrink_to_fit(this_01);
    read_bytes<int,int>(this,(long)(model->ncat).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(model->ncat).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2,in,buffer,
                        diff_endian);
    read_bytes<double,double>
              (this_00,(long)(model->col_means).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(model->col_means).super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3,in,buffer,diff_endian);
    read_bytes<int,int>(this_01,(long)(model->col_modes).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)(model->col_modes).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2,in,buffer,diff_endian);
    pvVar1 = (model->imputer_tree).
             super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (model->imputer_tree).
                   super__Vector_base<std::vector<ImputeNode,_std::allocator<ImputeNode>_>,_std::allocator<std::vector<ImputeNode,_std::allocator<ImputeNode>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_02 != pvVar1;
        this_02 = this_02 + 1) {
      read_bytes<unsigned_long,unsigned_long>(&veclen,1,in,buffer,diff_endian);
      std::vector<ImputeNode,_std::allocator<ImputeNode>_>::resize(this_02,veclen);
      std::vector<ImputeNode,_std::allocator<ImputeNode>_>::_M_shrink_to_fit(this_02);
      pIVar2 = (this_02->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (node_00 = (this_02->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
                     super__Vector_impl_data._M_start; node_00 != pIVar2; node_00 = node_00 + 1) {
        deserialize_node<char_const*,int,unsigned_long>(node_00,in,buffer,diff_endian);
      }
    }
  }
  return;
}

Assistant:

void deserialize_model(Imputer &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    size_t data_sizets[6];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)6, in, buffer, diff_endian);
    model.ncols_numeric = data_sizets[0];
    model.ncols_categ = data_sizets[1];
    model.ncat.resize(data_sizets[2]);
    model.imputer_tree.resize(data_sizets[3]);
    model.col_means.resize(data_sizets[4]);
    model.col_modes.resize(data_sizets[5]);

    model.ncat.shrink_to_fit();
    model.imputer_tree.shrink_to_fit();
    model.col_means.shrink_to_fit();
    model.col_modes.shrink_to_fit();

    read_bytes<int, saved_int_t>(model.ncat, model.ncat.size(), in, buffer, diff_endian);

    read_bytes<double, double>(model.col_means, model.col_means.size(), in, buffer, diff_endian);

    read_bytes<int, saved_int_t>(model.col_modes, model.col_modes.size(), in, buffer, diff_endian);

    size_t veclen;
    for (auto &tree : model.imputer_tree) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer, diff_endian);
    }
}